

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

const_iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::upper_bound
          (const_iterator *__return_storage_ptr__,
          setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,key_type *k)

{
  treeNode<int> *x;
  bool bVar1;
  reference y;
  less<int> local_7d;
  int local_7c;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_78;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> local_50;
  undefined1 local_38 [8];
  iterator it;
  key_type *k_local;
  setBase<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  it.m_node = (treeNode<int> *)k;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::begin
            ((const_iterator *)&local_50,
             &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
            ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38,&local_50);
  constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator
            ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)&local_50);
  do {
    treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
              ((const_iterator *)&local_78,
               &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
    bVar1 = operator!=((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38,&local_78);
    constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~constTreeIterator
              ((constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)&local_78);
    if (!bVar1) {
      local_7c = 2;
LAB_0010fde6:
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator
                ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
      if (local_7c != 1) {
        treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
                  (__return_storage_ptr__,
                   &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
      }
      return __return_storage_ptr__;
    }
    key_comp(this);
    x = it.m_node;
    y = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
    bVar1 = less<int>::operator()(&local_7d,&x->value,y);
    if (bVar1) {
      constTreeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::constTreeIterator
                (__return_storage_ptr__,
                 (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
      local_7c = 1;
      goto LAB_0010fde6;
    }
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
              ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_38);
  } while( true );
}

Assistant:

const_iterator	upper_bound(key_type const & k) const
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, *it)) return it;
		}
		return this->end();
	}